

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

ssize_t uv__fs_pathmax_size(char *path)

{
  ssize_t sVar1;
  
  sVar1 = pathconf(path,4);
  if (sVar1 == -1) {
    sVar1 = 0x1000;
  }
  return sVar1;
}

Assistant:

static ssize_t uv__fs_pathmax_size(const char* path) {
  ssize_t pathmax;

  pathmax = pathconf(path, _PC_PATH_MAX);

  if (pathmax == -1) {
#if defined(PATH_MAX)
    return PATH_MAX;
#else
#error "PATH_MAX undefined in the current platform"
#endif
  }

  return pathmax;
}